

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::Test_Htmlparser_Error::Test_Htmlparser_Error(Test_Htmlparser_Error *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(Htmlparser, Error) {
  HtmlParser html;

  EXPECT_EQ(html.GetErrorMessage(), (const char *)NULL);
  EXPECT_EQ(html.Parse("<a href='http://www.google.com' ''>\n"),
            HtmlParser::STATE_ERROR);

  EXPECT_STREQ(html.GetErrorMessage(),
               "Unexpected character '\\'' in state 'tag_space'");
  html.Reset();
  EXPECT_EQ(html.GetErrorMessage(), (const char *)NULL);
}